

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
mapbase_evaluator<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>
::mapbase_evaluator(mapbase_evaluator<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                    *this,XprType *map)

{
  Scalar *pSVar1;
  Index IVar2;
  XprType *map_local;
  mapbase_evaluator<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
  *this_local;
  
  evaluator_base<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  evaluator_base((evaluator_base<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)this);
  pSVar1 = MapBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::data((MapBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                   *)map);
  this->m_data = pSVar1;
  IVar2 = RefBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
          innerStride(&map->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     );
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x8,IVar2);
  IVar2 = RefBase<Eigen::Ref<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
          outerStride(&map->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     );
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_outerStride,IVar2);
  return;
}

Assistant:

explicit mapbase_evaluator(const XprType& map)
    : m_data(const_cast<PointerType>(map.data())),
      m_innerStride(map.innerStride()),
      m_outerStride(map.outerStride())
  {
    EIGEN_STATIC_ASSERT(EIGEN_IMPLIES(evaluator<Derived>::Flags&PacketAccessBit, internal::inner_stride_at_compile_time<Derived>::ret==1),
                        PACKET_ACCESS_REQUIRES_TO_HAVE_INNER_STRIDE_FIXED_TO_1);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }